

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

bool is_operator(Token *token)

{
  Kind KVar1;
  Token *token_local;
  
  KVar1 = token->kind;
  if ((((KVar1 - LE_EQ < 2) || (KVar1 == EM_EQ)) || (KVar1 - MUL_EQ < 6)) || (KVar1 - MOD_EQ < 4)) {
    token_local._4_4_ = 1;
  }
  else {
    token_local._4_4_ = 0;
  }
  return token_local._4_4_;
}

Assistant:

bool is_operator(Token *token) {
    switch (token->kind) {
        case ADD2:
        case SUB2:
        case BIG_EQ:
        case LE_EQ:
        case DIV_EQ:
        case SUB_EQ:
        case MUL_EQ:
        case MOD_EQ:
        case OR_EQ:
        case EM_EQ:
        case ADD_EQ:
        case AND_EQ:
        case XOR_EQ:
            return true;
        default:
            return false;
    }
}